

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

void print_mat(FILE *out,char *indent,m256v *M)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  
  if (0 < *(int *)indent) {
    uVar3 = 0;
    do {
      pcVar1 = " ";
      if (uVar3 == 0) {
        pcVar1 = "[";
      }
      fprintf((FILE *)out,"%s%s"," ",pcVar1);
      if (0 < *(int *)(indent + 4)) {
        lVar2 = 0;
        do {
          fprintf((FILE *)out," %02x",
                  (ulong)*(byte *)(lVar2 + *(long *)(indent + 8) * uVar3 + *(long *)(indent + 0x10))
                 );
          lVar2 = lVar2 + 1;
        } while (lVar2 < *(int *)(indent + 4));
      }
      pcVar1 = "";
      if (uVar3 == *(int *)indent - 1) {
        pcVar1 = " ]";
      }
      fprintf((FILE *)out,"%s\n",pcVar1);
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)*(int *)indent);
  }
  return;
}

Assistant:

UNUSED
static void print_mat(FILE* out, const char* indent, const m256v* M)
{
	for (int r = 0; r < M->n_row; ++r) {
		fprintf(out, "%s%s", indent, (r == 0 ? "[" : " "));
		for (int c = 0; c < M->n_col; ++c) {
			fprintf(out, " %02x", (int)m256v_get_el(M, r, c));
		}
		fprintf(out, "%s\n", ((r == M->n_row - 1) ? " ]" : ""));
	}
}